

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contour.cpp
# Opt level: O1

void __thiscall PathBuilder::write_out(PathBuilder *this,ostream *out)

{
  long lVar1;
  float *pfVar2;
  ostream *poVar3;
  float *pfVar4;
  long lVar5;
  int iVar6;
  Point *point;
  float *pfVar7;
  long lVar8;
  bool bVar9;
  
  lVar1 = *(long *)&this->field_0x8;
  for (lVar5 = *(long *)this; lVar5 != lVar1; lVar5 = lVar5 + 0x50) {
    if (*(long *)(lVar5 + 0x30) != *(long *)(lVar5 + 0x10)) {
      *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 8) = 4;
      std::__ostream_insert<char,std::char_traits<char>>(out,"<path d=\"M",10);
      pfVar7 = *(float **)(lVar5 + 0x10);
      pfVar2 = *(float **)(lVar5 + 0x30);
      if (pfVar7 != pfVar2) {
        pfVar4 = *(float **)(lVar5 + 0x20);
        lVar8 = *(long *)(lVar5 + 0x28);
        iVar6 = 1;
        do {
          bVar9 = iVar6 == 0;
          iVar6 = iVar6 + -1;
          if (bVar9) {
            std::__ostream_insert<char,std::char_traits<char>>(out,"L",1);
          }
          poVar3 = std::ostream::_M_insert<double>((double)*pfVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          poVar3 = std::ostream::_M_insert<double>((double)pfVar7[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          pfVar7 = pfVar7 + 2;
          if (pfVar7 == pfVar4) {
            pfVar7 = *(float **)(lVar8 + 8);
            lVar8 = lVar8 + 8;
            pfVar4 = pfVar7 + 0x80;
          }
        } while (pfVar7 != pfVar2);
      }
      lVar8 = *(long *)(lVar5 + 0x30);
      if (lVar8 == *(long *)(lVar5 + 0x38)) {
        lVar8 = *(long *)(*(long *)(lVar5 + 0x48) + -8) + 0x200;
      }
      if ((ABS(**(float **)(lVar5 + 0x10) - *(float *)(lVar8 + -8)) < 1e-08) &&
         (ABS((*(float **)(lVar5 + 0x10))[1] - *(float *)(lVar8 + -4)) < 1e-08)) {
        std::__ostream_insert<char,std::char_traits<char>>(out," Z",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"\" />\n",5);
    }
  }
  return;
}

Assistant:

void PathBuilder::write_out(std::ostream &out) const {
    for (const auto &path : paths) {
        if (path.empty()) {
            continue;
        }
        out << std::setprecision(4);
        out<<"<path d=\"M";
        int count = 0;
        for (const auto &point : path) {
            if (count == 1) {
                out<<"L";
            }
            out<<point.x<<" "<<point.y<<" ";
            count++;
        }
        if (path.front() == path.back()) {
            out<<" Z";
        }
        out<<"\" />\n";
    }
}